

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

BrailleCanvas * __thiscall plot::BrailleCanvas::pop(BrailleCanvas *this,TerminalOp op)

{
  _Fwd_list_node_base *p_Var1;
  
  p_Var1 = (this->stack_).
           super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
           ._M_impl._M_head._M_next;
  if (p_Var1 != (_Fwd_list_node_base *)0x0) {
    detail::braille::image_t::paint((image_t *)(p_Var1 + 1),&this->blocks_,op);
    std::
    _Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::
    _Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)&this->blocks_,
               (_Vector_impl_data *)
               ((this->stack_).
                super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                ._M_impl._M_head._M_next + 1));
    std::
    forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
    splice_after(&this->available_layers_,(const_iterator)&this->available_layers_,&this->stack_,
                 (const_iterator)&this->stack_);
  }
  return this;
}

Assistant:

BrailleCanvas& pop(TerminalOp op = TerminalOp::Over) {
        if (!stack_.empty()) {
            stack_.front().paint(blocks_, op);
            blocks_.swap(stack_.front());
            available_layers_.splice_after(available_layers_.before_begin(), stack_, stack_.before_begin());
        }
        return *this;
    }